

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

bitset<65UL>
jsoncons::decode_traits<std::bitset<65ul>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  uint uVar1;
  error_category *peVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ser_error *this;
  undefined4 extraout_var_01;
  size_t sVar4;
  undefined4 extraout_var_02;
  size_t sVar5;
  _Base_bitset<2UL> _Var6;
  error_code ec_00;
  error_code ec_01;
  undefined4 local_38;
  undefined8 local_30;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset(decoder);
  (*cursor->_vptr_basic_staj_cursor[6])(cursor,decoder,ec);
  if (ec->_M_value == 0) {
    if (decoder->is_valid_ != false) {
      json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
      ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&stack0xffffffffffffffb8);
      _Var6._M_w = (_WordT  [2])
                   json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<65UL>,_void>
                   ::as((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        &stack0xffffffffffffffb8);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb8);
      return (_Base_bitset<2UL>)(_Base_bitset<2UL>)_Var6._M_w;
    }
    this = (ser_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>
              ((error_code *)&stack0xffffffffffffffc8,conversion_failed);
    iVar3 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    iVar3 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    ec_01._4_4_ = 0;
    ec_01._M_value = local_38;
    ec_01._M_cat = (error_category *)local_30;
    ser_error::ser_error(this,ec_01,sVar4,sVar5);
  }
  else {
    this = (ser_error *)__cxa_allocate_exception(0x58);
    uVar1 = ec->_M_value;
    peVar2 = ec->_M_cat;
    iVar3 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    ec_00._4_4_ = 0;
    ec_00._M_value = uVar1;
    ec_00._M_cat = peVar2;
    ser_error::ser_error(this,ec_00,sVar4,sVar5);
  }
  __cxa_throw(this,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }